

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZFYsmpMatrix<long_double>::TPZMThread>::Resize
          (TPZVec<TPZFYsmpMatrix<long_double>::TPZMThread> *this,int64_t newsize)

{
  TPZMThread *pTVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  TPZMThread *pTVar4;
  long lVar5;
  undefined8 *puVar6;
  ulong uVar7;
  undefined8 *puVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  byte bVar12;
  
  bVar12 = 0;
  if (newsize < 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
  }
  lVar10 = this->fNElements;
  if (lVar10 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      if (this->fStore != (TPZMThread *)0x0) {
        operator_delete__(this->fStore);
      }
      this->fStore = (TPZMThread *)0x0;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = newsize;
      uVar7 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0x50),8) == 0) {
        uVar7 = SUB168(auVar2 * ZEXT816(0x50),0);
      }
      pTVar4 = (TPZMThread *)operator_new__(uVar7);
      if (newsize <= lVar10) {
        lVar10 = newsize;
      }
      pTVar1 = this->fStore;
      lVar9 = 0;
      if (lVar10 < 1) {
        lVar10 = lVar9;
      }
      while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
        puVar6 = (undefined8 *)((long)&pTVar1->target + lVar9);
        puVar8 = (undefined8 *)((long)&pTVar4->target + lVar9);
        for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar8 = *puVar6;
          puVar6 = puVar6 + (ulong)bVar12 * -2 + 1;
          puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
        }
        lVar9 = lVar9 + 0x50;
      }
      if (pTVar1 != (TPZMThread *)0x0) {
        operator_delete__(pTVar1);
      }
      this->fStore = pTVar4;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}